

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_flt3_arith(DisasContext_conflict6 *ctx,uint32_t opc,int fd,int fr,int fs,int ft)

{
  TCGContext_conflict6 *s;
  TCGLabel *l;
  TCGLabel *l_00;
  TCGTemp *pTVar1;
  TCGTemp *pTVar2;
  TCGTemp *pTVar3;
  TCGv_i64 a2;
  TCGv_i64 pTVar4;
  TCGv_i32 pTVar5;
  TCGOpcode opc_00;
  code *pcVar6;
  uintptr_t o_3;
  uintptr_t o_1;
  uintptr_t o_2;
  TCGv_i32 t;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  s = ctx->uc->tcg_ctx;
  switch(opc) {
  case 0x4c00001e:
    if (ctx->ps == false) {
      generate_exception(ctx,0x14);
    }
    if ((~ctx->hflags & 0xc0) != 0) {
      generate_exception_err(ctx,0x14,0);
    }
    local_38 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,true);
    pTVar4 = (TCGv_i64)((long)local_38 - (long)s);
    pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    pTVar5 = (TCGv_i32)((long)pTVar1 - (long)s);
    pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    t = (TCGv_i32)((long)pTVar1 - (long)s);
    l = gen_new_label_mips64el(s);
    l_00 = gen_new_label_mips64el(s);
    if (fr == 0) {
      opc_00 = INDEX_op_movi_i64;
      a2 = (TCGv_i64)0x0;
    }
    else {
      if (s->cpu_gpr[fr] == pTVar4) goto LAB_009b3f34;
      a2 = s->cpu_gpr[fr] + (long)s;
      opc_00 = INDEX_op_mov_i64;
    }
    tcg_gen_op2_mips64el(s,opc_00,(TCGArg)local_38,(TCGArg)a2);
LAB_009b3f34:
    tcg_gen_andi_i64_mips64el(s,pTVar4,pTVar4,7);
    tcg_gen_brcondi_i64_mips64el(s,TCG_COND_NE,pTVar4,0,l);
    gen_load_fpr32(ctx,pTVar5,fs);
    gen_load_fpr32h(ctx,t,fs);
    gen_store_fpr32(ctx,pTVar5,fd);
    gen_store_fpr32h(ctx,t,fd);
    *(short *)&l_00->field_0x2 =
         (short)((uint)*(ushort *)&l_00->field_0x2 * 0x10000 + 0x10000 >> 0x10);
    tcg_gen_op1_mips64el(s,INDEX_op_br,(TCGArg)l_00);
    *(byte *)l = *(byte *)l | 1;
    tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)l);
    tcg_gen_brcondi_i64_mips64el(s,TCG_COND_NE,pTVar4,4,l_00);
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar4 + (long)s));
    gen_load_fpr32h(ctx,t,fs);
    gen_load_fpr32(ctx,pTVar5,ft);
    gen_store_fpr32(ctx,t,fd);
    gen_store_fpr32h(ctx,pTVar5,fd);
    *(byte *)l_00 = *(byte *)l_00 | 1;
    tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)l_00);
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar5 + (long)s));
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)(t + (long)s));
    return;
  case 0x4c00001f:
  case 0x4c000022:
  case 0x4c000023:
  case 0x4c000024:
  case 0x4c000025:
  case 0x4c000027:
  case 0x4c00002a:
  case 0x4c00002b:
  case 0x4c00002c:
  case 0x4c00002d:
  case 0x4c00002f:
  case 0x4c000032:
  case 0x4c000033:
  case 0x4c000034:
  case 0x4c000035:
  case 0x4c000037:
switchD_009b347e_caseD_4c00001f:
    generate_exception_err(ctx,0x14,0);
    return;
  case 0x4c000020:
    if ((ctx->hflags & 0x80) == 0) {
      generate_exception_err(ctx,0x14,0);
    }
    pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    pTVar5 = (TCGv_i32)((long)pTVar3 - (long)s);
    gen_load_fpr32(ctx,(TCGv_i32)((long)pTVar1 - (long)s),fs);
    gen_load_fpr32(ctx,(TCGv_i32)((long)pTVar2 - (long)s),ft);
    gen_load_fpr32(ctx,pTVar5,fr);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    pcVar6 = helper_float_madd_s_mips64el;
    local_50 = pTVar1;
    local_48 = pTVar2;
    local_40 = pTVar3;
    goto LAB_009b3dd1;
  case 0x4c000021:
    if ((ctx->hflags & 0x80) == 0) {
      generate_exception_err(ctx,0x14,0);
    }
    if ((((fs | ft | fr | fd) & 1U) != 0) && ((ctx->hflags & 0x40) == 0)) {
      generate_exception_err(ctx,0x14,0);
    }
    pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar4 = (TCGv_i64)((long)pTVar3 - (long)s);
    gen_load_fpr64(ctx,(TCGv_i64)((long)pTVar1 - (long)s),fs);
    gen_load_fpr64(ctx,(TCGv_i64)((long)pTVar2 - (long)s),ft);
    gen_load_fpr64(ctx,pTVar4,fr);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    pcVar6 = helper_float_madd_d_mips64el;
    local_50 = pTVar1;
    local_48 = pTVar2;
    local_40 = pTVar3;
    break;
  case 0x4c000026:
    if (ctx->ps == false) {
      generate_exception(ctx,0x14);
    }
    if ((~ctx->hflags & 0xc0) != 0) {
      generate_exception_err(ctx,0x14,0);
    }
    pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar4 = (TCGv_i64)((long)pTVar3 - (long)s);
    gen_load_fpr64(ctx,(TCGv_i64)((long)pTVar1 - (long)s),fs);
    gen_load_fpr64(ctx,(TCGv_i64)((long)pTVar2 - (long)s),ft);
    gen_load_fpr64(ctx,pTVar4,fr);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    pcVar6 = helper_float_madd_ps_mips64el;
    local_50 = pTVar1;
    local_48 = pTVar2;
    local_40 = pTVar3;
    break;
  case 0x4c000028:
    if ((ctx->hflags & 0x80) == 0) {
      generate_exception_err(ctx,0x14,0);
    }
    pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    pTVar5 = (TCGv_i32)((long)pTVar3 - (long)s);
    gen_load_fpr32(ctx,(TCGv_i32)((long)pTVar1 - (long)s),fs);
    gen_load_fpr32(ctx,(TCGv_i32)((long)pTVar2 - (long)s),ft);
    gen_load_fpr32(ctx,pTVar5,fr);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    pcVar6 = helper_float_msub_s_mips64el;
    local_50 = pTVar1;
    local_48 = pTVar2;
    local_40 = pTVar3;
    goto LAB_009b3dd1;
  case 0x4c000029:
    if ((ctx->hflags & 0x80) == 0) {
      generate_exception_err(ctx,0x14,0);
    }
    if ((((fs | ft | fr | fd) & 1U) != 0) && ((ctx->hflags & 0x40) == 0)) {
      generate_exception_err(ctx,0x14,0);
    }
    pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar4 = (TCGv_i64)((long)pTVar3 - (long)s);
    gen_load_fpr64(ctx,(TCGv_i64)((long)pTVar1 - (long)s),fs);
    gen_load_fpr64(ctx,(TCGv_i64)((long)pTVar2 - (long)s),ft);
    gen_load_fpr64(ctx,pTVar4,fr);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    pcVar6 = helper_float_msub_d_mips64el;
    local_50 = pTVar1;
    local_48 = pTVar2;
    local_40 = pTVar3;
    break;
  case 0x4c00002e:
    if (ctx->ps == false) {
      generate_exception(ctx,0x14);
    }
    if ((~ctx->hflags & 0xc0) != 0) {
      generate_exception_err(ctx,0x14,0);
    }
    pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar4 = (TCGv_i64)((long)pTVar3 - (long)s);
    gen_load_fpr64(ctx,(TCGv_i64)((long)pTVar1 - (long)s),fs);
    gen_load_fpr64(ctx,(TCGv_i64)((long)pTVar2 - (long)s),ft);
    gen_load_fpr64(ctx,pTVar4,fr);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    pcVar6 = helper_float_msub_ps_mips64el;
    local_50 = pTVar1;
    local_48 = pTVar2;
    local_40 = pTVar3;
    break;
  case 0x4c000030:
    if ((ctx->hflags & 0x80) == 0) {
      generate_exception_err(ctx,0x14,0);
    }
    pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    pTVar5 = (TCGv_i32)((long)pTVar3 - (long)s);
    gen_load_fpr32(ctx,(TCGv_i32)((long)pTVar1 - (long)s),fs);
    gen_load_fpr32(ctx,(TCGv_i32)((long)pTVar2 - (long)s),ft);
    gen_load_fpr32(ctx,pTVar5,fr);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    pcVar6 = helper_float_nmadd_s_mips64el;
    local_50 = pTVar1;
    local_48 = pTVar2;
    local_40 = pTVar3;
    goto LAB_009b3dd1;
  case 0x4c000031:
    if ((ctx->hflags & 0x80) == 0) {
      generate_exception_err(ctx,0x14,0);
    }
    if ((((fs | ft | fr | fd) & 1U) != 0) && ((ctx->hflags & 0x40) == 0)) {
      generate_exception_err(ctx,0x14,0);
    }
    pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar4 = (TCGv_i64)((long)pTVar3 - (long)s);
    gen_load_fpr64(ctx,(TCGv_i64)((long)pTVar1 - (long)s),fs);
    gen_load_fpr64(ctx,(TCGv_i64)((long)pTVar2 - (long)s),ft);
    gen_load_fpr64(ctx,pTVar4,fr);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    pcVar6 = helper_float_nmadd_d_mips64el;
    local_50 = pTVar1;
    local_48 = pTVar2;
    local_40 = pTVar3;
    break;
  case 0x4c000036:
    if (ctx->ps == false) {
      generate_exception(ctx,0x14);
    }
    if ((~ctx->hflags & 0xc0) != 0) {
      generate_exception_err(ctx,0x14,0);
    }
    pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar4 = (TCGv_i64)((long)pTVar3 - (long)s);
    gen_load_fpr64(ctx,(TCGv_i64)((long)pTVar1 - (long)s),fs);
    gen_load_fpr64(ctx,(TCGv_i64)((long)pTVar2 - (long)s),ft);
    gen_load_fpr64(ctx,pTVar4,fr);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    pcVar6 = helper_float_nmadd_ps_mips64el;
    local_50 = pTVar1;
    local_48 = pTVar2;
    local_40 = pTVar3;
    break;
  case 0x4c000038:
    if ((ctx->hflags & 0x80) == 0) {
      generate_exception_err(ctx,0x14,0);
    }
    pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    pTVar5 = (TCGv_i32)((long)pTVar3 - (long)s);
    gen_load_fpr32(ctx,(TCGv_i32)((long)pTVar1 - (long)s),fs);
    gen_load_fpr32(ctx,(TCGv_i32)((long)pTVar2 - (long)s),ft);
    gen_load_fpr32(ctx,pTVar5,fr);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    pcVar6 = helper_float_nmsub_s_mips64el;
    local_50 = pTVar1;
    local_48 = pTVar2;
    local_40 = pTVar3;
LAB_009b3dd1:
    pTVar3 = local_40;
    pTVar2 = local_48;
    pTVar1 = local_50;
    tcg_gen_callN_mips64el(s,pcVar6,local_40,4,&local_58);
    tcg_temp_free_internal_mips64el(s,pTVar1);
    tcg_temp_free_internal_mips64el(s,pTVar2);
    gen_store_fpr32(ctx,pTVar5,fd);
    goto LAB_009b3f06;
  case 0x4c000039:
    if ((ctx->hflags & 0x80) == 0) {
      generate_exception_err(ctx,0x14,0);
    }
    if ((((fs | ft | fr | fd) & 1U) != 0) && ((ctx->hflags & 0x40) == 0)) {
      generate_exception_err(ctx,0x14,0);
    }
    pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar4 = (TCGv_i64)((long)pTVar3 - (long)s);
    gen_load_fpr64(ctx,(TCGv_i64)((long)pTVar1 - (long)s),fs);
    gen_load_fpr64(ctx,(TCGv_i64)((long)pTVar2 - (long)s),ft);
    gen_load_fpr64(ctx,pTVar4,fr);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    pcVar6 = helper_float_nmsub_d_mips64el;
    local_50 = pTVar1;
    local_48 = pTVar2;
    local_40 = pTVar3;
    break;
  default:
    if (opc != 0x4c00003e) goto switchD_009b347e_caseD_4c00001f;
    if (ctx->ps == false) {
      generate_exception(ctx,0x14);
    }
    if ((~ctx->hflags & 0xc0) != 0) {
      generate_exception_err(ctx,0x14,0);
    }
    pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar4 = (TCGv_i64)((long)pTVar3 - (long)s);
    gen_load_fpr64(ctx,(TCGv_i64)((long)pTVar1 - (long)s),fs);
    gen_load_fpr64(ctx,(TCGv_i64)((long)pTVar2 - (long)s),ft);
    gen_load_fpr64(ctx,pTVar4,fr);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    pcVar6 = helper_float_nmsub_ps_mips64el;
    local_50 = pTVar1;
    local_48 = pTVar2;
    local_40 = pTVar3;
  }
  pTVar3 = local_40;
  pTVar2 = local_48;
  pTVar1 = local_50;
  tcg_gen_callN_mips64el(s,pcVar6,local_40,4,&local_58);
  tcg_temp_free_internal_mips64el(s,pTVar1);
  tcg_temp_free_internal_mips64el(s,pTVar2);
  gen_store_fpr64(ctx,pTVar4,fd);
LAB_009b3f06:
  tcg_temp_free_internal_mips64el(s,pTVar3);
  return;
}

Assistant:

static void gen_flt3_arith(DisasContext *ctx, uint32_t opc,
                           int fd, int fr, int fs, int ft)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    switch (opc) {
    case OPC_ALNV_PS:
        check_ps(ctx);
        {
            TCGv t0 = tcg_temp_local_new(tcg_ctx);
            TCGv_i32 fp = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fph = tcg_temp_new_i32(tcg_ctx);
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);

            gen_load_gpr(tcg_ctx, t0, fr);
            tcg_gen_andi_tl(tcg_ctx, t0, t0, 0x7);

            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t0, 0, l1);
            gen_load_fpr32(ctx, fp, fs);
            gen_load_fpr32h(ctx, fph, fs);
            gen_store_fpr32(ctx, fp, fd);
            gen_store_fpr32h(ctx, fph, fd);
            tcg_gen_br(tcg_ctx, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t0, 4, l2);
            tcg_temp_free(tcg_ctx, t0);
#ifdef TARGET_WORDS_BIGENDIAN
            gen_load_fpr32(ctx, fp, fs);
            gen_load_fpr32h(ctx, fph, ft);
            gen_store_fpr32h(ctx, fp, fd);
            gen_store_fpr32(ctx, fph, fd);
#else
            gen_load_fpr32h(ctx, fph, fs);
            gen_load_fpr32(ctx, fp, ft);
            gen_store_fpr32(ctx, fph, fd);
            gen_store_fpr32h(ctx, fp, fd);
#endif
            gen_set_label(tcg_ctx, l2);
            tcg_temp_free_i32(tcg_ctx, fp);
            tcg_temp_free_i32(tcg_ctx, fph);
        }
        break;
    case OPC_MADD_S:
        check_cop1x(ctx);
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fp1 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fp2 = tcg_temp_new_i32(tcg_ctx);

            gen_load_fpr32(ctx, fp0, fs);
            gen_load_fpr32(ctx, fp1, ft);
            gen_load_fpr32(ctx, fp2, fr);
            gen_helper_float_madd_s(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i32(tcg_ctx, fp0);
            tcg_temp_free_i32(tcg_ctx, fp1);
            gen_store_fpr32(ctx, fp2, fd);
            tcg_temp_free_i32(tcg_ctx, fp2);
        }
        break;
    case OPC_MADD_D:
        check_cop1x(ctx);
        check_cp1_registers(ctx, fd | fs | ft | fr);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);

            gen_load_fpr64(ctx, fp0, fs);
            gen_load_fpr64(ctx, fp1, ft);
            gen_load_fpr64(ctx, fp2, fr);
            gen_helper_float_madd_d(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i64(tcg_ctx, fp0);
            tcg_temp_free_i64(tcg_ctx, fp1);
            gen_store_fpr64(ctx, fp2, fd);
            tcg_temp_free_i64(tcg_ctx, fp2);
        }
        break;
    case OPC_MADD_PS:
        check_ps(ctx);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);

            gen_load_fpr64(ctx, fp0, fs);
            gen_load_fpr64(ctx, fp1, ft);
            gen_load_fpr64(ctx, fp2, fr);
            gen_helper_float_madd_ps(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i64(tcg_ctx, fp0);
            tcg_temp_free_i64(tcg_ctx, fp1);
            gen_store_fpr64(ctx, fp2, fd);
            tcg_temp_free_i64(tcg_ctx, fp2);
        }
        break;
    case OPC_MSUB_S:
        check_cop1x(ctx);
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fp1 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fp2 = tcg_temp_new_i32(tcg_ctx);

            gen_load_fpr32(ctx, fp0, fs);
            gen_load_fpr32(ctx, fp1, ft);
            gen_load_fpr32(ctx, fp2, fr);
            gen_helper_float_msub_s(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i32(tcg_ctx, fp0);
            tcg_temp_free_i32(tcg_ctx, fp1);
            gen_store_fpr32(ctx, fp2, fd);
            tcg_temp_free_i32(tcg_ctx, fp2);
        }
        break;
    case OPC_MSUB_D:
        check_cop1x(ctx);
        check_cp1_registers(ctx, fd | fs | ft | fr);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);

            gen_load_fpr64(ctx, fp0, fs);
            gen_load_fpr64(ctx, fp1, ft);
            gen_load_fpr64(ctx, fp2, fr);
            gen_helper_float_msub_d(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i64(tcg_ctx, fp0);
            tcg_temp_free_i64(tcg_ctx, fp1);
            gen_store_fpr64(ctx, fp2, fd);
            tcg_temp_free_i64(tcg_ctx, fp2);
        }
        break;
    case OPC_MSUB_PS:
        check_ps(ctx);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);

            gen_load_fpr64(ctx, fp0, fs);
            gen_load_fpr64(ctx, fp1, ft);
            gen_load_fpr64(ctx, fp2, fr);
            gen_helper_float_msub_ps(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i64(tcg_ctx, fp0);
            tcg_temp_free_i64(tcg_ctx, fp1);
            gen_store_fpr64(ctx, fp2, fd);
            tcg_temp_free_i64(tcg_ctx, fp2);
        }
        break;
    case OPC_NMADD_S:
        check_cop1x(ctx);
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fp1 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fp2 = tcg_temp_new_i32(tcg_ctx);

            gen_load_fpr32(ctx, fp0, fs);
            gen_load_fpr32(ctx, fp1, ft);
            gen_load_fpr32(ctx, fp2, fr);
            gen_helper_float_nmadd_s(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i32(tcg_ctx, fp0);
            tcg_temp_free_i32(tcg_ctx, fp1);
            gen_store_fpr32(ctx, fp2, fd);
            tcg_temp_free_i32(tcg_ctx, fp2);
        }
        break;
    case OPC_NMADD_D:
        check_cop1x(ctx);
        check_cp1_registers(ctx, fd | fs | ft | fr);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);

            gen_load_fpr64(ctx, fp0, fs);
            gen_load_fpr64(ctx, fp1, ft);
            gen_load_fpr64(ctx, fp2, fr);
            gen_helper_float_nmadd_d(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i64(tcg_ctx, fp0);
            tcg_temp_free_i64(tcg_ctx, fp1);
            gen_store_fpr64(ctx, fp2, fd);
            tcg_temp_free_i64(tcg_ctx, fp2);
        }
        break;
    case OPC_NMADD_PS:
        check_ps(ctx);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);

            gen_load_fpr64(ctx, fp0, fs);
            gen_load_fpr64(ctx, fp1, ft);
            gen_load_fpr64(ctx, fp2, fr);
            gen_helper_float_nmadd_ps(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i64(tcg_ctx, fp0);
            tcg_temp_free_i64(tcg_ctx, fp1);
            gen_store_fpr64(ctx, fp2, fd);
            tcg_temp_free_i64(tcg_ctx, fp2);
        }
        break;
    case OPC_NMSUB_S:
        check_cop1x(ctx);
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fp1 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 fp2 = tcg_temp_new_i32(tcg_ctx);

            gen_load_fpr32(ctx, fp0, fs);
            gen_load_fpr32(ctx, fp1, ft);
            gen_load_fpr32(ctx, fp2, fr);
            gen_helper_float_nmsub_s(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i32(tcg_ctx, fp0);
            tcg_temp_free_i32(tcg_ctx, fp1);
            gen_store_fpr32(ctx, fp2, fd);
            tcg_temp_free_i32(tcg_ctx, fp2);
        }
        break;
    case OPC_NMSUB_D:
        check_cop1x(ctx);
        check_cp1_registers(ctx, fd | fs | ft | fr);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);

            gen_load_fpr64(ctx, fp0, fs);
            gen_load_fpr64(ctx, fp1, ft);
            gen_load_fpr64(ctx, fp2, fr);
            gen_helper_float_nmsub_d(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i64(tcg_ctx, fp0);
            tcg_temp_free_i64(tcg_ctx, fp1);
            gen_store_fpr64(ctx, fp2, fd);
            tcg_temp_free_i64(tcg_ctx, fp2);
        }
        break;
    case OPC_NMSUB_PS:
        check_ps(ctx);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);

            gen_load_fpr64(ctx, fp0, fs);
            gen_load_fpr64(ctx, fp1, ft);
            gen_load_fpr64(ctx, fp2, fr);
            gen_helper_float_nmsub_ps(tcg_ctx, fp2, tcg_ctx->cpu_env, fp0, fp1, fp2);
            tcg_temp_free_i64(tcg_ctx, fp0);
            tcg_temp_free_i64(tcg_ctx, fp1);
            gen_store_fpr64(ctx, fp2, fd);
            tcg_temp_free_i64(tcg_ctx, fp2);
        }
        break;
    default:
        MIPS_INVAL("flt3_arith");
        generate_exception_end(ctx, EXCP_RI);
        return;
    }
}